

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O0

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  uint geomID;
  int p11;
  int p10;
  int p01;
  int p00;
  int theta_1;
  Vertex *v;
  float thetaf;
  float phif;
  int theta;
  int phi;
  float rcpNumPhi;
  float rcpNumTheta;
  int tri;
  Triangle *triangles;
  Vertex *vertices;
  RTCGeometry geom;
  __m128 r_2;
  __m128 a_1;
  __m128 r_1;
  __m128 a;
  int local_264;
  int local_24c;
  int local_248;
  int local_23c;
  ulong local_168;
  ulong local_128;
  float local_98;
  float local_58;
  
  uVar6 = rtcNewGeometry(g_device);
  lVar7 = rtcSetNewGeometryBuffer(uVar6,1,0,0x9003,0x10,0x348);
  lVar8 = rtcSetNewGeometryBuffer(uVar6,0,0,0x5003,0xc,0x5f0);
  local_23c = 0;
  local_168 = SUB168(ZEXT416(0x42200000),0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_168;
  auVar14 = rcpss(auVar14,auVar14);
  local_98 = auVar14._0_4_;
  local_128 = SUB168(ZEXT416(0x41a00000),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_128;
  auVar14 = rcpss(auVar2,auVar2);
  local_58 = auVar14._0_4_;
  for (local_248 = 0; local_248 < 0x15; local_248 = local_248 + 1) {
    for (local_24c = 0; local_24c < 0x28; local_24c = local_24c + 1) {
      fVar10 = (float)local_248 * 3.1415927 * local_58 * (2.0 - local_58 * 20.0);
      fVar11 = (float)local_24c * 2.0 * 3.1415927 * local_98 * (2.0 - local_98 * 40.0);
      pfVar9 = (float *)(lVar7 + (long)(local_248 * 0x28 + local_24c) * 0x10);
      fVar1 = *in_RSI;
      fVar12 = sinf(fVar10);
      fVar13 = sinf(fVar11);
      *pfVar9 = in_XMM0_Da * fVar12 * fVar13 + fVar1;
      fVar1 = in_RSI[1];
      fVar12 = cosf(fVar10);
      pfVar9[1] = in_XMM0_Da * fVar12 + fVar1;
      fVar1 = in_RSI[2];
      fVar10 = sinf(fVar10);
      fVar11 = cosf(fVar11);
      pfVar9[2] = in_XMM0_Da * fVar10 * fVar11 + fVar1;
    }
    if (local_248 != 0) {
      for (local_264 = 1; local_264 < 0x29; local_264 = local_264 + 1) {
        iVar3 = (local_248 + -1) * 0x28 + local_264 % 0x28;
        iVar4 = local_248 * 0x28 + local_264 + -1;
        if (1 < local_248) {
          *(int *)(lVar8 + (long)local_23c * 0xc) = iVar4;
          *(int *)(lVar8 + (long)local_23c * 0xc + 4) = iVar3;
          *(int *)(lVar8 + (long)local_23c * 0xc + 8) = (local_248 + -1) * 0x28 + local_264 + -1;
          local_23c = local_23c + 1;
        }
        if (local_248 < 0x14) {
          *(int *)(lVar8 + (long)local_23c * 0xc) = local_248 * 0x28 + local_264 % 0x28;
          *(int *)(lVar8 + (long)local_23c * 0xc + 4) = iVar3;
          *(int *)(lVar8 + (long)local_23c * 0xc + 8) = iVar4;
          local_23c = local_23c + 1;
        }
      }
    }
  }
  rtcCommitGeometry(uVar6);
  uVar5 = rtcAttachGeometry(in_RDI,uVar6);
  rtcReleaseGeometry(uVar6);
  return uVar5;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* map triangle and vertex buffers */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, sizeof(Vertex), numTheta*(numPhi+1));
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, sizeof(Triangle), 2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  for (int phi=0; phi<=numPhi; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      const float phif   = phi*float(pi)*rcpNumPhi;
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      Vertex& v = vertices[phi*numTheta+theta];
      v.x = p.x + r*sin(phif)*sin(thetaf);
      v.y = p.y + r*cos(phif);
      v.z = p.z + r*sin(phif)*cos(thetaf);
    }
    if (phi == 0) continue;

    for (int theta=1; theta<=numTheta; theta++)
    {
      int p00 = (phi-1)*numTheta+theta-1;
      int p01 = (phi-1)*numTheta+theta%numTheta;
      int p10 = phi*numTheta+theta-1;
      int p11 = phi*numTheta+theta%numTheta;

      if (phi > 1) {
        triangles[tri].v0 = p10;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p00;
        tri++;
      }

      if (phi < numPhi) {
        triangles[tri].v0 = p11;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p10;
        tri++;
      }
    }
  }

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}